

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall
ON_ClassArray<ON_BrepLoop>::Append(ON_ClassArray<ON_BrepLoop> *this,int count,ON_BrepLoop *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  if (p != (ON_BrepLoop *)0x0 && 0 < count) {
    iVar1 = this->m_count;
    uVar2 = iVar1 + count;
    if (this->m_capacity < (int)uVar2) {
      if ((iVar1 < 8) || ((ulong)((long)iVar1 * 0x78) < 0x10000001)) {
        uVar4 = 4;
        if (2 < iVar1) {
          uVar4 = iVar1 * 2;
        }
      }
      else {
        iVar3 = 0x22222a;
        if (iVar1 < 0x22222a) {
          iVar3 = iVar1;
        }
        uVar4 = iVar3 + iVar1;
      }
      if ((int)uVar2 < (int)uVar4) {
        uVar2 = uVar4;
      }
      if ((uint)this->m_capacity < uVar2) {
        SetCapacity(this,(long)(int)uVar2);
      }
    }
    uVar5 = 1;
    if (1 < count) {
      uVar5 = (ulong)(uint)count;
    }
    do {
      iVar1 = this->m_count;
      this->m_count = iVar1 + 1;
      ON_BrepLoop::operator=(this->m_a + iVar1,p);
      p = p + 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  return;
}

Assistant:

void ON_ClassArray<T>::Append( int count, const T* p ) 
{
  int i;
  if ( count > 0 && p ) 
  {
    if ( count + m_count > m_capacity ) 
    {
      int newcapacity = NewCapacity();
      if ( newcapacity < count + m_count )
        newcapacity = count + m_count;
      Reserve( newcapacity );
    }
    for ( i = 0; i < count; i++ ) {
      m_a[m_count++] = p[i];
    }
  }
}